

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::IOBlock::glslTraverseBasicType
          (string *__return_storage_ptr__,IOBlock *this,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  pointer pcVar1;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_a0 [2];
  long local_90 [2];
  string local_80;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  BasicTypeVisitFunc local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < (int)((ulong)((long)(this->m_members).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_members).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
    lVar4 = 0x20;
    lVar5 = 0;
    local_38 = visit;
    do {
      local_a0[0] = local_90;
      pcVar1 = (this->m_interfaceName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a0,pcVar1,pcVar1 + (this->m_interfaceName)._M_string_length);
      std::__cxx11::string::append((char *)local_a0);
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_a0,
                                  *(ulong *)((long)(this->m_members).
                                                                                                      
                                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                            lVar4 + -0x20));
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_80.field_2._M_allocated_capacity = *psVar3;
        local_80.field_2._8_8_ = plVar2[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar3;
        local_80._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_80._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      glslTraverseBasicTypes
                (&local_60,&local_80,
                 (VarType *)
                 ((long)&(((this->m_members).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                           ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                 lVar4),0,indentationDepth,local_38);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0],local_90[0] + 1);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar5 < (int)((ulong)((long)(this->m_members).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_members).
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x49249249);
  }
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::IOBlock::glslTraverseBasicType (int indentationDepth, BasicTypeVisitFunc visit) const
{
	string result;
	for (int i = 0; i < (int)m_members.size(); i++)
		result += UserDefinedIOCase::glslTraverseBasicTypes(m_interfaceName + "." + m_members[i].name, m_members[i].type, 0, indentationDepth, visit);
	return result;
}